

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O0

int singlylinkedlist_foreach
              (SINGLYLINKEDLIST_HANDLE list,LIST_ACTION_FUNCTION action_function,
              void *action_context)

{
  byte local_41;
  LIST_ITEM_INSTANCE *pLStack_40;
  _Bool continue_processing;
  LIST_ITEM_INSTANCE *list_item;
  LIST_INSTANCE *list_instance;
  LOGGER_LOG l;
  void *pvStack_20;
  int result;
  void *action_context_local;
  LIST_ACTION_FUNCTION action_function_local;
  SINGLYLINKEDLIST_HANDLE list_local;
  
  pvStack_20 = action_context;
  action_context_local = action_function;
  action_function_local = (LIST_ACTION_FUNCTION)list;
  if ((list == (SINGLYLINKEDLIST_HANDLE)0x0) || (action_function == (LIST_ACTION_FUNCTION)0x0)) {
    list_instance = (LIST_INSTANCE *)xlogging_get_log_function();
    if (list_instance != (LIST_INSTANCE *)0x0) {
      (*(code *)list_instance)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/singlylinkedlist.c"
                 ,"singlylinkedlist_foreach",0x159,1,
                 "Invalid argument (list=%p, action_function=%p)",action_function_local,
                 action_context_local);
    }
    l._4_4_ = 0x15a;
  }
  else {
    list_item = (LIST_ITEM_INSTANCE *)list;
    for (pLStack_40 = list->head; pLStack_40 != (LIST_ITEM_INSTANCE *)0x0;
        pLStack_40 = (LIST_ITEM_INSTANCE *)pLStack_40->next) {
      local_41 = 0;
      (*(code *)action_context_local)(pLStack_40->item,pvStack_20,&local_41);
      if ((local_41 & 1) == 0) break;
    }
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int singlylinkedlist_foreach(SINGLYLINKEDLIST_HANDLE list, LIST_ACTION_FUNCTION action_function, const void* action_context)
{
    int result;

    /* Codes_SRS_LIST_09_008: [ If the list or the action_function argument is NULL, singlylinkedlist_foreach shall return non-zero value. ] */
    if ((list == NULL) ||
        (action_function == NULL))
    {
        LogError("Invalid argument (list=%p, action_function=%p)", list, action_function);
        result = MU_FAILURE;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* list_item = list_instance->head;

        while (list_item != NULL)
        {
            bool continue_processing = false;

            /* Codes_SRS_LIST_09_009: [ singlylinkedlist_foreach shall iterate through all items in a list and invoke action_function for each one of them. ] */
            action_function(list_item->item, action_context, &continue_processing);

            /* Codes_SRS_LIST_09_010: [ If the condition function returns continue_processing as false, singlylinkedlist_foreach shall stop iterating through the list and return. ] */
            if (continue_processing == false)
            {
                break;
            }

            list_item = (LIST_ITEM_INSTANCE*)list_item->next;
        }

        /* Codes_SRS_LIST_09_011: [ If no errors occur, singlylinkedlist_foreach shall return zero. ] */
        result = 0;
    }

    return result;
}